

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O1

nvpair_t * nvpair_create_descriptor_array(char *name,int *value,size_t nitems)

{
  int __fd;
  int iVar1;
  void *__ptr;
  nvpair_t *pnVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  
  if (value == (int *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  else {
    __ptr = malloc(nitems * 4);
    uVar4 = 0;
    if (__ptr != (void *)0x0) {
      if (nitems != 0) {
        pnVar2 = (nvpair_t *)0x0;
        uVar5 = 0;
        do {
          uVar4 = (uint)uVar5;
          if (value[uVar5] == -1) {
            *(undefined4 *)((long)__ptr + uVar5 * 4) = 0xffffffff;
          }
          else {
            iVar1 = fcntl(value[uVar5],0x406,0);
            *(int *)((long)__ptr + uVar5 * 4) = iVar1;
            if (iVar1 == -1) goto LAB_0010c07f;
          }
          uVar4 = uVar4 + 1;
          uVar5 = (ulong)uVar4;
        } while (uVar5 < nitems);
      }
      pnVar2 = nvpair_allocv(name,0xc,(uint64_t)__ptr,nitems * 8,nitems);
LAB_0010c07f:
      if (pnVar2 != (nvpair_t *)0x0) {
        return pnVar2;
      }
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      if (uVar4 != 0) {
        uVar5 = (ulong)uVar4;
        do {
          __fd = *(int *)((long)__ptr + uVar5 * 4 + -4);
          if (__fd != -1) {
            close(__fd);
          }
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      free(__ptr);
      *piVar3 = iVar1;
      return (nvpair_t *)0x0;
    }
  }
  return (nvpair_t *)0x0;
}

Assistant:

nvpair_t *
nvpair_create_descriptor_array(const char *name, const int *value,
    size_t nitems)
{
	unsigned int ii;
	nvpair_t *nvp;
	int *fds;

	if (value == NULL) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	nvp = NULL;

	fds = nv_malloc(sizeof(value[0]) * nitems);
	if (fds == NULL)
		return (NULL);
	for (ii = 0; ii < nitems; ii++) {
		if (value[ii] == -1) {
			fds[ii] = -1;
		} else {
			fds[ii] = fcntl(value[ii], F_DUPFD_CLOEXEC, 0);
			if (fds[ii] == -1)
				goto fail;
		}
	}

	nvp = nvpair_allocv(name, NV_TYPE_DESCRIPTOR_ARRAY,
	    (uint64_t)(uintptr_t)fds, sizeof(int64_t) * nitems, nitems);

fail:
	if (nvp == NULL) {
		ERRNO_SAVE();
		for (; ii > 0; ii--) {
			if (fds[ii - 1] != -1)
				close(fds[ii - 1]);
		}
		nv_free(fds);
		ERRNO_RESTORE();
	}

	return (nvp);
}